

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::XThreadFulfiller<void>::reject(XThreadFulfiller<void> *this,Exception *exception)

{
  XThreadPaf *in_RAX;
  FulfillScope scope;
  FulfillScope local_18;
  
  local_18.obj = in_RAX;
  XThreadPaf::FulfillScope::FulfillScope(&local_18,&this->target);
  if ((local_18.obj != (XThreadPaf *)0x0) &&
     (*(char *)&local_18.obj[1].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember
      == '\0')) {
    Exception::Exception
              ((Exception *)&local_18.obj[1].super_PromiseNode.super_PromiseArenaMember.arena,
               exception);
    *(undefined1 *)
     &local_18.obj[1].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember = 1;
  }
  XThreadPaf::FulfillScope::~FulfillScope(&local_18);
  return;
}

Assistant:

void reject(Exception&& exception) const override {
    XThreadPaf::FulfillScope scope(&target);
    if (scope.shouldFulfill()) {
      scope.getTarget<T>()->result.addException(kj::mv(exception));
    }
  }